

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

bool testing::internal::
     TypeParameterizedTest<google::protobuf::internal::Utf8ValidationTest,_testing::internal::TemplateSel<google::protobuf::internal::gtest_suite_Utf8ValidationTest_::ReadInvalidUTF8String>,_testing::internal::Types<proto2_unittest::TestAllTypes>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Alloc_hider type_param;
  int iVar3;
  long *plVar4;
  char *pcVar5;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  long *plVar6;
  size_type *psVar7;
  type_info *extraout_RDX;
  type_info *extraout_RDX_00;
  type_info *extraout_RDX_01;
  type_info *extraout_RDX_02;
  type_info *type;
  undefined1 *puVar8;
  long *plVar9;
  ulong uVar10;
  allocator<char> local_189;
  long *local_188;
  long local_180;
  undefined1 local_178;
  undefined7 uStack_177;
  undefined8 uStack_170;
  string local_168;
  long *local_148;
  long local_140;
  long local_138;
  undefined8 uStack_130;
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c8;
  string local_c0;
  CodeLocation local_a0;
  long *local_78 [2];
  long local_68 [2];
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  int local_38;
  
  local_c8 = type_names;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,prefix,&local_189);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_78);
  local_128 = &local_118;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_118 = *plVar6;
    lStack_110 = plVar4[3];
  }
  else {
    local_118 = *plVar6;
    local_128 = (long *)*plVar4;
  }
  local_120 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_128);
  local_108 = &local_f8;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_f8 = *plVar6;
    lStack_f0 = plVar4[3];
  }
  else {
    local_f8 = *plVar6;
    local_108 = (long *)*plVar4;
  }
  local_100 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_108);
  local_e8 = &local_d8;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_d8 = *plVar6;
    lStack_d0 = plVar4[3];
  }
  else {
    local_d8 = *plVar6;
    local_e8 = (long *)*plVar4;
  }
  local_e0 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_e8,
                              (ulong)(local_c8->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[index]._M_dataplus.
                                     _M_p);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_168.field_2._M_allocated_capacity = *psVar7;
    local_168.field_2._8_8_ = plVar4[3];
  }
  else {
    local_168.field_2._M_allocated_capacity = *psVar7;
    local_168._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_168._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  pcVar5 = strchr(test_names,0x2c);
  if (pcVar5 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,test_names,(allocator<char> *)&local_c0);
    type = extraout_RDX_00;
  }
  else {
    local_188 = (long *)&local_178;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,test_names,pcVar5);
    type = extraout_RDX;
  }
  plVar4 = local_188;
  if (local_180 != 0) {
    puVar8 = (undefined1 *)((long)local_188 + local_180);
    do {
      plVar6 = local_188;
      iVar3 = isspace((uint)(byte)puVar8[-1]);
      type = extraout_RDX_01;
      plVar4 = plVar6;
      if (iVar3 == 0) break;
      plVar9 = (long *)(puVar8 + -1);
      uVar10 = (long)plVar9 - (long)plVar6;
      std::__cxx11::string::_M_erase((ulong)&local_188,uVar10);
      puVar8 = (undefined1 *)((long)local_188 + uVar10);
      type = extraout_RDX_02;
      plVar4 = local_188;
    } while (plVar9 != plVar6);
  }
  local_188 = (long *)&local_178;
  if (plVar4 == local_188) {
    uStack_130 = uStack_170;
    plVar4 = &local_138;
  }
  local_138 = CONCAT71(uStack_177,local_178);
  local_140 = local_180;
  local_180 = 0;
  local_178 = 0;
  local_148 = plVar4;
  GetTypeName_abi_cxx11_(&local_c0,(internal *)&proto2_unittest::TestAllTypes::typeinfo,type);
  type_param._M_p = local_c0._M_dataplus._M_p;
  paVar1 = &local_a0.file.field_2;
  pcVar2 = (code_location->file)._M_dataplus._M_p;
  local_a0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar2,pcVar2 + (code_location->file)._M_string_length);
  local_a0.line = code_location->line;
  set_up_tc = SuiteApiResolver<google::protobuf::internal::gtest_suite_Utf8ValidationTest_::ReadInvalidUTF8String<proto2_unittest::TestAllTypes>_>
              ::GetSetUpCaseOrSuite((code_location->file)._M_dataplus._M_p,local_a0.line);
  tear_down_tc = SuiteApiResolver<google::protobuf::internal::gtest_suite_Utf8ValidationTest_::ReadInvalidUTF8String<proto2_unittest::TestAllTypes>_>
                 ::GetTearDownCaseOrSuite
                           ((code_location->file)._M_dataplus._M_p,code_location->line);
  factory = (TestFactoryBase *)operator_new(8);
  factory->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_018c6868;
  MakeAndRegisterTestInfo
            (&local_168,(char *)plVar4,type_param._M_p,(char *)0x0,&local_a0,
             &TypeIdHelper<google::protobuf::internal::Utf8ValidationTest<proto2_unittest::TestAllTypes>>
              ::dummy_,set_up_tc,tear_down_tc,factory);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.file._M_dataplus._M_p,local_a0.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148,local_138 + 1);
  }
  if (local_188 != (long *)&local_178) {
    operator_delete(local_188,CONCAT71(uStack_177,local_178) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,local_f8 + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_58 = (size_type *)(code_location->file)._M_dataplus._M_p;
  paVar1 = &(code_location->file).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58 == paVar1) {
    local_48 = paVar1->_M_allocated_capacity;
    uStack_40 = *(undefined8 *)((long)&(code_location->file).field_2 + 8);
    local_58 = &local_48;
  }
  else {
    local_48 = paVar1->_M_allocated_capacity;
  }
  local_50 = (code_location->file)._M_string_length;
  (code_location->file)._M_dataplus._M_p = (pointer)paVar1;
  (code_location->file)._M_string_length = 0;
  (code_location->file).field_2._M_local_buf[0] = '\0';
  local_38 = code_location->line;
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  return true;
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)]),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>::
        Register(prefix, std::move(code_location), case_name, test_names,
                 index + 1, type_names);
  }